

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O3

int mriStep_SetNonlinConvCoef(ARKodeMem ark_mem,sunrealtype nlscoef)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_20;
  double local_18;
  
  local_18 = nlscoef;
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetNonlinConvCoef",&local_20);
  if (iVar1 == 0) {
    local_20->nlscoef =
         (sunrealtype)
         (~-(ulong)(0.0 < local_18) & 0x3fb999999999999a |
         (ulong)local_18 & -(ulong)(0.0 < local_18));
  }
  return iVar1;
}

Assistant:

int mriStep_SetNonlinConvCoef(ARKodeMem ark_mem, sunrealtype nlscoef)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* argument <= 0 sets default, otherwise set input */
  if (nlscoef <= ZERO) { step_mem->nlscoef = NLSCOEF; }
  else { step_mem->nlscoef = nlscoef; }

  return (ARK_SUCCESS);
}